

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

matd_t * matd_identity(int dim)

{
  uint uVar1;
  int local_24;
  int i;
  matd_t *m;
  matd_t *pmStack_10;
  int dim_local;
  
  if (dim == 0) {
    pmStack_10 = matd_create_scalar(1.0);
  }
  else {
    pmStack_10 = matd_create(dim,dim);
    for (local_24 = 0; local_24 < dim; local_24 = local_24 + 1) {
      uVar1 = pmStack_10->ncols;
      pmStack_10[(ulong)(local_24 * uVar1 + local_24) + 1].nrows = 0;
      pmStack_10[(ulong)(local_24 * uVar1 + local_24) + 1].ncols = 0x3ff00000;
    }
  }
  return pmStack_10;
}

Assistant:

matd_t *matd_identity(int dim)
{
    if (dim == 0)
        return matd_create_scalar(1);

    matd_t *m = matd_create(dim, dim);
    for (int i = 0; i < dim; i++)
        MATD_EL(m, i, i) = 1;

    return m;
}